

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O0

int big_file_mpi_create_block
              (BigFile *bf,BigBlock *block,char *blockname,char *dtype,int nmemb,int Nfile,
              size_t size,MPI_Comm comm)

{
  long lVar1;
  int iVar2;
  long alStack_70 [3];
  ulong local_58 [2];
  int local_44;
  ulong uStack_40;
  int i;
  unsigned_long __vla_expr0;
  int local_30;
  int local_2c;
  int Nfile_local;
  int nmemb_local;
  char *dtype_local;
  char *blockname_local;
  BigBlock *block_local;
  BigFile *bf_local;
  
  block_local = (BigBlock *)bf;
  blockname_local = block->dtype;
  dtype_local = blockname;
  _Nfile_local = dtype;
  local_2c = nmemb;
  local_30 = Nfile;
  __vla_expr0 = (unsigned_long)local_58;
  lVar1 = -((ulong)(uint)Nfile * 8 + 0xf & 0xfffffffffffffff0);
  local_58[1] = (long)local_58 + lVar1;
  uStack_40 = (ulong)(uint)Nfile;
  for (local_44 = 0; local_44 < Nfile; local_44 = local_44 + 1) {
    local_58[0] = (size * (long)(local_44 + 1)) / (ulong)(long)Nfile;
    *(ulong *)(local_58[1] + (long)local_44 * 8) =
         local_58[0] - (size * (long)local_44) / (ulong)(long)Nfile;
  }
  *(ulong *)((long)alStack_70 + lVar1 + 8) = local_58[1];
  *(MPI_Comm *)((long)alStack_70 + lVar1 + 0x10) = comm;
  *(undefined8 *)((long)alStack_70 + lVar1) = 0x104ce4;
  iVar2 = _big_file_mpi_create_block
                    (bf,block,blockname,dtype,nmemb,Nfile,*(size_t **)((long)alStack_70 + lVar1 + 8)
                     ,*(MPI_Comm *)((long)alStack_70 + lVar1 + 0x10));
  return iVar2;
}

Assistant:

int
big_file_mpi_create_block(BigFile * bf,
        BigBlock * block,
        const char * blockname,
        const char * dtype,
        int nmemb,
        int Nfile,
        size_t size,
        MPI_Comm comm)
{
    size_t fsize[Nfile];
    int i;
    for(i = 0; i < Nfile; i ++) {
        fsize[i] = size * (i + 1) / Nfile
                 - size * (i) / Nfile;
    }
    return _big_file_mpi_create_block(bf, block, blockname, dtype,
        nmemb, Nfile, fsize, comm);
}